

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O0

void opj_t1_decode_cblks(opj_tcd_t *tcd,OPJ_BOOL *pret,opj_tcd_tilecomp_t *tilec,opj_tccp_t *tccp,
                        opj_event_mgr_t *p_manager,opj_mutex_t *p_manager_mutex,OPJ_BOOL check_pterm
                        )

{
  opj_thread_pool_t *tp_00;
  opj_tcd_resolution_t *poVar1;
  opj_tcd_cblk_enc_t *poVar2;
  OPJ_BOOL OVar3;
  int iVar4;
  opj_tcd_band_t *poVar5;
  opj_tcd_precinct_t *poVar6;
  long lVar7;
  OPJ_BOOL *user_data;
  OPJ_UINT32 cblk_h;
  OPJ_UINT32 cblk_w;
  opj_t1_cblk_decode_processing_job_t *job;
  opj_tcd_cblk_dec_t *cblk_1;
  opj_tcd_cblk_dec_t *cblk;
  opj_tcd_precinct_t *precinct;
  opj_tcd_band_t *band;
  opj_tcd_resolution_t *res;
  OPJ_UINT32 cblkno;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  opj_thread_pool_t *tp;
  opj_mutex_t *p_manager_mutex_local;
  opj_event_mgr_t *p_manager_local;
  opj_tccp_t *tccp_local;
  opj_tcd_tilecomp_t *tilec_local;
  OPJ_BOOL *pret_local;
  opj_tcd_t *tcd_local;
  
  tp_00 = tcd->thread_pool;
  precno = 0;
  do {
    if (tilec->minimum_num_resolutions <= precno) {
      return;
    }
    poVar1 = tilec->resolutions;
    for (cblkno = 0; cblkno < poVar1[precno].numbands; cblkno = cblkno + 1) {
      poVar5 = poVar1[precno].bands + cblkno;
      for (res._4_4_ = 0; res._4_4_ < poVar1[precno].pw * poVar1[precno].ph;
          res._4_4_ = res._4_4_ + 1) {
        poVar6 = poVar5->precincts + res._4_4_;
        OVar3 = opj_tcd_is_subband_area_of_interest
                          (tcd,tilec->compno,precno,poVar5->bandno,poVar6->x0,poVar6->y0,poVar6->x1,
                           poVar6->y1);
        if (OVar3 == 0) {
          for (res._0_4_ = 0; (uint)res < poVar6->cw * poVar6->ch; res._0_4_ = (uint)res + 1) {
            poVar2 = (poVar6->cblks).enc;
            if (*(long *)((long)poVar2 + (ulong)(uint)res * 0x48 + 0x40) != 0) {
              opj_aligned_free(*(void **)((long)poVar2 + (ulong)(uint)res * 0x48 + 0x40));
              *(undefined8 *)((long)poVar2 + (ulong)(uint)res * 0x48 + 0x40) = 0;
            }
          }
        }
        else {
          for (res._0_4_ = 0; (uint)res < poVar6->cw * poVar6->ch; res._0_4_ = (uint)res + 1) {
            lVar7 = (long)(poVar6->cblks).enc + (ulong)(uint)res * 0x48;
            OVar3 = opj_tcd_is_subband_area_of_interest
                              (tcd,tilec->compno,precno,poVar5->bandno,*(OPJ_UINT32 *)(lVar7 + 0x10)
                               ,*(OPJ_UINT32 *)(lVar7 + 0x14),*(OPJ_UINT32 *)(lVar7 + 0x18),
                               *(OPJ_UINT32 *)(lVar7 + 0x1c));
            if (OVar3 == 0) {
              if (*(long *)(lVar7 + 0x40) != 0) {
                opj_aligned_free(*(void **)(lVar7 + 0x40));
                *(undefined8 *)(lVar7 + 0x40) = 0;
              }
            }
            else {
              if (tcd->whole_tile_decoding == 0) {
                if (((*(long *)(lVar7 + 0x40) != 0) ||
                    (*(int *)(lVar7 + 0x18) == *(int *)(lVar7 + 0x10))) ||
                   (*(int *)(lVar7 + 0x1c) == *(int *)(lVar7 + 0x14))) goto LAB_0013c5b5;
              }
              user_data = (OPJ_BOOL *)opj_calloc(1,0x50);
              if (user_data == (OPJ_BOOL *)0x0) {
                *pret = 0;
                return;
              }
              *user_data = tcd->whole_tile_decoding;
              user_data[1] = precno;
              *(long *)(user_data + 2) = lVar7;
              *(opj_tcd_band_t **)(user_data + 4) = poVar5;
              *(opj_tcd_tilecomp_t **)(user_data + 6) = tilec;
              *(opj_tccp_t **)(user_data + 8) = tccp;
              *(OPJ_BOOL **)(user_data + 0xc) = pret;
              *(opj_mutex_t **)(user_data + 0x10) = p_manager_mutex;
              *(opj_event_mgr_t **)(user_data + 0xe) = p_manager;
              user_data[0x12] = check_pterm;
              iVar4 = opj_thread_pool_get_thread_count(tp_00);
              user_data[10] = (uint)(1 < iVar4);
              opj_thread_pool_submit_job(tp_00,opj_t1_clbl_decode_processor,user_data);
              if (*pret == 0) {
                return;
              }
            }
LAB_0013c5b5:
          }
        }
      }
    }
    precno = precno + 1;
  } while( true );
}

Assistant:

void opj_t1_decode_cblks(opj_tcd_t* tcd,
                         volatile OPJ_BOOL* pret,
                         opj_tcd_tilecomp_t* tilec,
                         opj_tccp_t* tccp,
                         opj_event_mgr_t *p_manager,
                         opj_mutex_t* p_manager_mutex,
                         OPJ_BOOL check_pterm
                        )
{
    opj_thread_pool_t* tp = tcd->thread_pool;
    OPJ_UINT32 resno, bandno, precno, cblkno;

#ifdef DEBUG_VERBOSE
    OPJ_UINT32 codeblocks_decoded = 0;
    printf("Enter opj_t1_decode_cblks()\n");
#endif

    for (resno = 0; resno < tilec->minimum_num_resolutions; ++resno) {
        opj_tcd_resolution_t* res = &tilec->resolutions[resno];

        for (bandno = 0; bandno < res->numbands; ++bandno) {
            opj_tcd_band_t* OPJ_RESTRICT band = &res->bands[bandno];

            for (precno = 0; precno < res->pw * res->ph; ++precno) {
                opj_tcd_precinct_t* precinct = &band->precincts[precno];

                if (!opj_tcd_is_subband_area_of_interest(tcd,
                        tilec->compno,
                        resno,
                        band->bandno,
                        (OPJ_UINT32)precinct->x0,
                        (OPJ_UINT32)precinct->y0,
                        (OPJ_UINT32)precinct->x1,
                        (OPJ_UINT32)precinct->y1)) {
                    for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                        opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                        if (cblk->decoded_data) {
#ifdef DEBUG_VERBOSE
                            printf("Discarding codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            opj_aligned_free(cblk->decoded_data);
                            cblk->decoded_data = NULL;
                        }
                    }
                    continue;
                }

                for (cblkno = 0; cblkno < precinct->cw * precinct->ch; ++cblkno) {
                    opj_tcd_cblk_dec_t* cblk = &precinct->cblks.dec[cblkno];
                    opj_t1_cblk_decode_processing_job_t* job;

                    if (!opj_tcd_is_subband_area_of_interest(tcd,
                            tilec->compno,
                            resno,
                            band->bandno,
                            (OPJ_UINT32)cblk->x0,
                            (OPJ_UINT32)cblk->y0,
                            (OPJ_UINT32)cblk->x1,
                            (OPJ_UINT32)cblk->y1)) {
                        if (cblk->decoded_data) {
#ifdef DEBUG_VERBOSE
                            printf("Discarding codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            opj_aligned_free(cblk->decoded_data);
                            cblk->decoded_data = NULL;
                        }
                        continue;
                    }

                    if (!tcd->whole_tile_decoding) {
                        OPJ_UINT32 cblk_w = (OPJ_UINT32)(cblk->x1 - cblk->x0);
                        OPJ_UINT32 cblk_h = (OPJ_UINT32)(cblk->y1 - cblk->y0);
                        if (cblk->decoded_data != NULL) {
#ifdef DEBUG_VERBOSE
                            printf("Reusing codeblock %d,%d at resno=%d, bandno=%d\n",
                                   cblk->x0, cblk->y0, resno, bandno);
#endif
                            continue;
                        }
                        if (cblk_w == 0 || cblk_h == 0) {
                            continue;
                        }
#ifdef DEBUG_VERBOSE
                        printf("Decoding codeblock %d,%d at resno=%d, bandno=%d\n",
                               cblk->x0, cblk->y0, resno, bandno);
#endif
                    }

                    job = (opj_t1_cblk_decode_processing_job_t*) opj_calloc(1,
                            sizeof(opj_t1_cblk_decode_processing_job_t));
                    if (!job) {
                        *pret = OPJ_FALSE;
                        return;
                    }
                    job->whole_tile_decoding = tcd->whole_tile_decoding;
                    job->resno = resno;
                    job->cblk = cblk;
                    job->band = band;
                    job->tilec = tilec;
                    job->tccp = tccp;
                    job->pret = pret;
                    job->p_manager_mutex = p_manager_mutex;
                    job->p_manager = p_manager;
                    job->check_pterm = check_pterm;
                    job->mustuse_cblkdatabuffer = opj_thread_pool_get_thread_count(tp) > 1;
                    opj_thread_pool_submit_job(tp, opj_t1_clbl_decode_processor, job);
#ifdef DEBUG_VERBOSE
                    codeblocks_decoded ++;
#endif
                    if (!(*pret)) {
                        return;
                    }
                } /* cblkno */
            } /* precno */
        } /* bandno */
    } /* resno */

#ifdef DEBUG_VERBOSE
    printf("Leave opj_t1_decode_cblks(). Number decoded: %d\n", codeblocks_decoded);
#endif
    return;
}